

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.h
# Opt level: O0

int mk_iov_init(mk_iov *iov,int n,int offset)

{
  int local_1c;
  int i;
  int offset_local;
  int n_local;
  mk_iov *iov_local;
  
  iov->iov_idx = offset;
  iov->buf_idx = 0;
  iov->total_len = 0;
  iov->size = n;
  if (0 < offset) {
    for (local_1c = 0; local_1c < offset; local_1c = local_1c + 1) {
      iov->io[local_1c].iov_base = (void *)0x0;
      iov->io[local_1c].iov_len = 0;
    }
  }
  return 0;
}

Assistant:

static inline int mk_iov_init(struct mk_iov *iov, int n, int offset)
{
    int i;

    iov->iov_idx    = offset;
    iov->buf_idx    = 0;
    iov->total_len  = 0;
    iov->size       = n;

    /*
     * Make sure to set to zero initial entries when an offset
     * is specified
     */
    if (offset > 0) {
        for (i = 0; i < offset; i++) {
            iov->io[i].iov_base = NULL;
            iov->io[i].iov_len = 0;
        }
    }

    return 0;
}